

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O3

Barcodes *
ZXing::Pdf417::DoDecode
          (Barcodes *__return_storage_ptr__,BinaryBitmap *image,bool multiple,bool tryRotate,
          bool returnErrors)

{
  list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
  *__x;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  Result *pRVar4;
  Result *extraout_RAX;
  Result *extraout_RAX_00;
  Result *extraout_RAX_01;
  Result *extraout_RAX_02;
  Result *extraout_RAX_03;
  Result *extraout_RAX_04;
  Result *extraout_RAX_05;
  Result *extraout_RAX_06;
  byte bVar5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  _List_node_base *p_Var13;
  char cVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  BarcodeFormat local_1ac;
  anon_class_48_1_ba1d7400 rotate;
  Result detectorResult;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  PointT<int> local_128;
  int local_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  PointT<int> local_110;
  DecoderResult decoderResult;
  
  pRVar4 = Detector::Detect(&detectorResult,image,multiple,tryRotate);
  __x = &detectorResult.points;
  if (detectorResult.points.
      super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)__x) {
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    rotate.res.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    rotate.res.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = detectorResult.bits.
                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    if (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (detectorResult.bits.
              super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (detectorResult.bits.
              super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    std::__cxx11::
    list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ::list(&rotate.res.points,__x);
    pRVar4 = (Result *)(ulong)(uint)detectorResult.rotation;
    rotate.res.rotation = detectorResult.rotation;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (detectorResult.points.
        super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)__x) {
      bVar3 = false;
      p_Var13 = detectorResult.points.
                super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      do {
        bVar5 = *(byte *)&p_Var13[7]._M_next & *(byte *)&p_Var13[1]._M_next;
        uVar6 = 0x7878787;
        if (bVar5 == 1) {
          uVar15 = (int)(double)p_Var13[1]._M_prev - (int)(double)p_Var13[7]._M_prev;
          uVar6 = -uVar15;
          if (0 < (int)uVar15) {
            uVar6 = uVar15;
          }
        }
        bVar7 = *(byte *)&p_Var13[4]._M_next & *(byte *)&p_Var13[10]._M_next;
        uVar15 = 0x71c71c6;
        if (bVar7 == 1) {
          iVar16 = (int)(double)p_Var13[10]._M_prev - (int)(double)p_Var13[4]._M_prev;
          iVar9 = -iVar16;
          if (0 < iVar16) {
            iVar9 = iVar16;
          }
          uVar15 = (uint)(iVar9 * 0x11) / 0x12;
        }
        bVar8 = *(byte *)&p_Var13[8]._M_prev & *(byte *)&p_Var13[2]._M_prev;
        uVar11 = 0x7878787;
        if (bVar8 == 1) {
          uVar17 = (int)(double)p_Var13[3]._M_next - (int)(double)p_Var13[9]._M_next;
          uVar11 = -uVar17;
          if (0 < (int)uVar17) {
            uVar11 = uVar17;
          }
        }
        bVar10 = *(byte *)&p_Var13[5]._M_prev & *(byte *)&p_Var13[0xb]._M_prev;
        uVar17 = 0x71c71c6;
        if (bVar10 == 1) {
          iVar16 = (int)(double)p_Var13[0xc]._M_next - (int)(double)p_Var13[6]._M_next;
          iVar9 = -iVar16;
          if (0 < iVar16) {
            iVar9 = iVar16;
          }
          uVar17 = (uint)(iVar9 * 0x11) / 0x12;
        }
        if (uVar17 < uVar11) {
          uVar11 = uVar17;
        }
        if (uVar15 < uVar6) {
          uVar6 = uVar15;
        }
        if (uVar11 < uVar6) {
          uVar6 = uVar11;
        }
        uVar15 = 0;
        uVar11 = 0;
        if (bVar5 != 0) {
          uVar17 = (int)(double)p_Var13[1]._M_prev - (int)(double)p_Var13[7]._M_prev;
          uVar11 = -uVar17;
          if (0 < (int)uVar17) {
            uVar11 = uVar17;
          }
        }
        if (bVar7 != 0) {
          iVar16 = (int)(double)p_Var13[10]._M_prev - (int)(double)p_Var13[4]._M_prev;
          iVar9 = -iVar16;
          if (0 < iVar16) {
            iVar9 = iVar16;
          }
          uVar15 = (uint)(iVar9 * 0x11) / 0x12;
        }
        uVar17 = 0;
        uVar12 = 0;
        if (bVar8 != 0) {
          uVar18 = (int)(double)p_Var13[3]._M_next - (int)(double)p_Var13[9]._M_next;
          uVar12 = -uVar18;
          if (0 < (int)uVar18) {
            uVar12 = uVar18;
          }
        }
        if (bVar10 != 0) {
          iVar16 = (int)(double)p_Var13[0xc]._M_next - (int)(double)p_Var13[6]._M_next;
          iVar9 = -iVar16;
          if (0 < iVar16) {
            iVar9 = iVar16;
          }
          uVar17 = (uint)(iVar9 * 0x11) / 0x12;
        }
        if (uVar15 < uVar11) {
          uVar15 = uVar11;
        }
        if (uVar17 < uVar12) {
          uVar17 = uVar12;
        }
        if (uVar17 < uVar15) {
          uVar17 = uVar15;
        }
        ScanningDecoder::Decode
                  (&decoderResult,
                   detectorResult.bits.
                   super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (Nullable<ZXing::ResultPoint> *)(p_Var13 + 7),
                   (Nullable<ZXing::ResultPoint> *)&p_Var13[8]._M_prev,
                   (Nullable<ZXing::ResultPoint> *)(p_Var13 + 10),
                   (Nullable<ZXing::ResultPoint> *)&p_Var13[0xb]._M_prev,uVar6,uVar17);
        if (decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
            .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
            decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
            .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          cVar14 = '\x01';
          if (returnErrors && decoderResult._error._type != None) goto LAB_0017594d;
        }
        else {
          cVar14 = '\x01';
          if (decoderResult._error._type == None || returnErrors) {
LAB_0017594d:
            uVar6 = (uint)(double)p_Var13[1]._M_prev;
            local_128.x = (uint)(double)p_Var13[2]._M_next;
            if (rotate.res.rotation == 0x10e) {
              iVar16 = (rotate.res.bits.
                        super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_width;
              local_128.y = ~uVar6 + iVar16;
              local_120 = (int)(double)p_Var13[5]._M_next;
              iStack_118 = (int)(double)p_Var13[6]._M_prev;
              uVar19 = CONCAT44((int)(double)p_Var13[6]._M_next,(int)(double)p_Var13[4]._M_prev) ^
                       0xffffffffffffffff;
              iStack_11c = iVar16 + (int)uVar19;
              iStack_114 = iVar16 + (int)(uVar19 >> 0x20);
              iVar9 = (int)(double)p_Var13[3]._M_prev;
              iVar16 = ~(int)(double)p_Var13[3]._M_next + iVar16;
LAB_00175aab:
              local_110.y = iVar16;
              local_110.x = iVar9;
            }
            else if (rotate.res.rotation == 0xb4) {
              uVar15 = ~local_128.x;
              uVar1 = (rotate.res.bits.
                       super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->_width;
              uVar2 = (rotate.res.bits.
                       super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->_height;
              local_128.x = ~uVar6 + uVar1;
              uVar19 = CONCAT44((int)(double)p_Var13[5]._M_next,(int)(double)p_Var13[4]._M_prev) ^
                       0xffffffffffffffff;
              local_120 = uVar1 + (int)uVar19;
              iStack_11c = uVar2 + (int)(uVar19 >> 0x20);
              iStack_118 = uVar1 + ((int)(double)p_Var13[6]._M_next ^ 0xffffffffU);
              iStack_114 = uVar2 + ((int)(double)p_Var13[6]._M_prev ^ 0xffffffffU);
              local_128.y = uVar2 + uVar15;
              uVar19 = CONCAT44((int)(double)p_Var13[3]._M_prev,(int)(double)p_Var13[3]._M_next) ^
                       0xffffffffffffffff;
              local_110.x = (int)uVar19 + uVar1;
              local_110.y = (int)(uVar19 >> 0x20) + uVar2;
            }
            else {
              if (rotate.res.rotation == 0x5a) {
                iVar9 = (rotate.res.bits.
                         super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->_height;
                local_128.x = ~local_128.x + iVar9;
                local_128.y = uVar6;
                iStack_11c = (int)(double)p_Var13[4]._M_prev;
                iStack_114 = (int)(double)p_Var13[6]._M_next;
                uVar19 = CONCAT44((int)(double)p_Var13[6]._M_prev,(int)(double)p_Var13[5]._M_next) ^
                         0xffffffffffffffff;
                local_120 = iVar9 + (int)uVar19;
                iStack_118 = iVar9 + (int)(uVar19 >> 0x20);
                iVar16 = (int)(double)p_Var13[3]._M_next;
                iVar9 = ~(int)(double)p_Var13[3]._M_prev + iVar9;
                goto LAB_00175aab;
              }
              local_128.y = local_128.x;
              local_128.x = uVar6;
              local_120 = (int)(double)p_Var13[4]._M_prev;
              iStack_118 = (int)(double)p_Var13[6]._M_next;
              iStack_11c = (int)(double)p_Var13[5]._M_next;
              iStack_114 = (int)(double)p_Var13[6]._M_prev;
              local_110.x = (int)(double)p_Var13[3]._M_next;
              local_110.y = (int)(double)p_Var13[3]._M_prev;
            }
            local_138 = (undefined1  [16])0x0;
            local_148 = (undefined1  [16])0x0;
            local_1ac = PDF417;
            std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
            emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                      ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)__return_storage_ptr__
                       ,&decoderResult,(DetectorResult *)local_148,&local_1ac);
            if ((pointer)local_148._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_148._8_8_,local_138._8_8_ - local_148._8_8_);
            }
            bVar3 = (bool)(bVar3 | !multiple);
            cVar14 = multiple;
          }
        }
        if (decoderResult._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (decoderResult._extra.
                     super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decoderResult._error._msg._M_dataplus._M_p != &decoderResult._error._msg.field_2) {
          operator_delete(decoderResult._error._msg._M_dataplus._M_p,
                          decoderResult._error._msg.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decoderResult._structuredAppend.id._M_dataplus._M_p !=
            &decoderResult._structuredAppend.id.field_2) {
          operator_delete(decoderResult._structuredAppend.id._M_dataplus._M_p,
                          decoderResult._structuredAppend.id.field_2._M_allocated_capacity + 1);
        }
        pRVar4 = (Result *)&decoderResult._ecLevel.field_2;
        if ((Result *)decoderResult._ecLevel._M_dataplus._M_p != pRVar4) {
          operator_delete(decoderResult._ecLevel._M_dataplus._M_p,
                          decoderResult._ecLevel.field_2._M_allocated_capacity + 1);
          pRVar4 = extraout_RAX;
        }
        if (decoderResult._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(decoderResult._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)decoderResult._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)decoderResult._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          pRVar4 = extraout_RAX_00;
        }
        if (decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
            .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(decoderResult._content.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)decoderResult._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)decoderResult._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          pRVar4 = extraout_RAX_01;
        }
        if (cVar14 == '\0') {
          if (!bVar3) {
            std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                      (__return_storage_ptr__);
            pRVar4 = extraout_RAX_02;
          }
          break;
        }
        p_Var13 = p_Var13->_M_next;
      } while (p_Var13 != (_List_node_base *)__x);
    }
    while (rotate.res.points.
           super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
           ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&rotate.res.points)
    {
      p_Var13 = (rotate.res.points.
                 super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(rotate.res.points.
                      super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,0xd0);
      pRVar4 = extraout_RAX_03;
      rotate.res.points.
      super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var13;
    }
    if (rotate.res.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (rotate.res.bits.
                 super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      pRVar4 = extraout_RAX_04;
    }
  }
  while (detectorResult.points.
         super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)__x) {
    p_Var13 = (detectorResult.points.
               super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
               ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(detectorResult.points.
                    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0xd0);
    pRVar4 = extraout_RAX_05;
    detectorResult.points.
    super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var13;
  }
  if (detectorResult.bits.super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (detectorResult.bits.
               super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    pRVar4 = extraout_RAX_06;
  }
  return (Barcodes *)pRVar4;
}

Assistant:

static Barcodes DoDecode(const BinaryBitmap& image, bool multiple, bool tryRotate, bool returnErrors)
{
	Detector::Result detectorResult = Detector::Detect(image, multiple, tryRotate);
	if (detectorResult.points.empty())
		return {};

	auto rotate = [res = detectorResult](PointI p) {
		switch(res.rotation) {
		case 90: return PointI(res.bits->height() - p.y - 1, p.x);
		case 180: return PointI(res.bits->width() - p.x - 1, res.bits->height() - p.y - 1);
		case 270: return PointI(p.y, res.bits->width() - p.x - 1);
		}
		return p;
	};

	Barcodes res;
	for (const auto& points : detectorResult.points) {
		DecoderResult decoderResult =
			ScanningDecoder::Decode(*detectorResult.bits, points[4], points[5], points[6], points[7],
									GetMinCodewordWidth(points), GetMaxCodewordWidth(points));
		if (decoderResult.isValid(returnErrors)) {
			auto point = [&](int i) { return rotate(PointI(points[i].value())); };
			res.emplace_back(std::move(decoderResult), DetectorResult{{}, {point(0), point(2), point(3), point(1)}},
							 BarcodeFormat::PDF417);
			if (!multiple)
				return res;
		}
	}
	return res;
}